

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::CloseEvent,QWindow*>(QWindow *args)

{
  QWindow *w;
  QAbstractEventDispatcher *pQVar1;
  WindowSystemEventList *in_RDI;
  QAbstractEventDispatcher *dispatcher;
  CloseEvent *in_stack_fffffffffffffff0;
  
  w = (QWindow *)operator_new(0x28);
  QWindowSystemInterfacePrivate::CloseEvent::CloseEvent(in_stack_fffffffffffffff0,w);
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (in_RDI,&in_stack_fffffffffffffff0->super_WindowSystemEvent);
  pQVar1 = QGuiApplicationPrivate::qt_qpa_core_dispatcher();
  if (pQVar1 != (QAbstractEventDispatcher *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent(Args ...args)
{
    QWindowSystemInterfacePrivate::windowSystemEventQueue.append(new EventType(args...));
    if (QAbstractEventDispatcher *dispatcher = QGuiApplicationPrivate::qt_qpa_core_dispatcher())
        dispatcher->wakeUp();
    return true;
}